

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_terrain.cpp
# Opt level: O2

void SetSplashDefaults(FSplashDef *splashdef)

{
  int iVar1;
  
  iVar1 = S_FindSound((char *)0x0);
  (splashdef->NormalSplashSound).ID = iVar1;
  (splashdef->SmallSplashSound).ID = iVar1;
  splashdef->SplashChunk = (PClassActor *)0x0;
  splashdef->SmallSplash = (PClassActor *)0x0;
  splashdef->SplashBase = (PClassActor *)0x0;
  splashdef->ChunkBaseZVel = 1.0;
  splashdef->SmallSplashClip = 12.0;
  splashdef->ChunkXVelShift = '\b';
  splashdef->ChunkYVelShift = '\b';
  splashdef->ChunkZVelShift = '\b';
  splashdef->NoAlert = false;
  return;
}

Assistant:

static void SetSplashDefaults (FSplashDef *splashdef)
{
	splashdef->SmallSplashSound =
		splashdef->NormalSplashSound = 0;
	splashdef->SmallSplash =
		splashdef->SplashBase =
		splashdef->SplashChunk = NULL;
	splashdef->ChunkXVelShift =
		splashdef->ChunkYVelShift =
		splashdef->ChunkZVelShift = 8;
	splashdef->ChunkBaseZVel = 1;
	splashdef->SmallSplashClip = 12.;
	splashdef->NoAlert = false;
}